

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Swap(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
     *this,RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  RepeatedPtrFieldBase *in_RSI;
  RepeatedPtrFieldBase *in_RDI;
  RepeatedPtrFieldBase *in_stack_00000058;
  RepeatedPtrFieldBase *in_stack_00000060;
  RepeatedPtrFieldBase *in_stack_00000088;
  RepeatedPtrFieldBase *in_stack_00000090;
  
  if (in_RDI != in_RSI) {
    pAVar1 = internal::RepeatedPtrFieldBase::GetArena(in_RSI);
    pAVar2 = internal::RepeatedPtrFieldBase::GetArena(in_RDI);
    if (pAVar1 == pAVar2) {
      internal::RepeatedPtrFieldBase::InternalSwap(in_stack_00000090,in_stack_00000088);
    }
    else {
      internal::RepeatedPtrFieldBase::
      SwapFallback<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                (in_stack_00000060,in_stack_00000058);
    }
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::Swap(RepeatedPtrField* other) {
  if (this == other) return;
  RepeatedPtrFieldBase::Swap<TypeHandler>(other);
}